

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

ByteArray *
ot::commissioner::CommissionerImpl::GetPendingOperationalDatasetTlvs
          (ByteArray *__return_storage_ptr__,uint16_t aDatasetFlags)

{
  GetActiveOperationalDatasetTlvs(__return_storage_ptr__,aDatasetFlags);
  if ((aDatasetFlags & 0x20) != 0) {
    EncodeTlvType(__return_storage_ptr__,kDelayTimer);
  }
  if ((aDatasetFlags & 0x10) != 0) {
    EncodeTlvType(__return_storage_ptr__,kPendingTimestamp);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetPendingOperationalDatasetTlvs(uint16_t aDatasetFlags)
{
    auto tlvTypes = GetActiveOperationalDatasetTlvs(aDatasetFlags);

    if (aDatasetFlags & PendingOperationalDataset::kDelayTimerBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kDelayTimer);
    }
    if (aDatasetFlags & PendingOperationalDataset::kPendingTimestampBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kPendingTimestamp);
    }

    return tlvTypes;
}